

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_edwards_decompress(void)

{
  mp_int *in_RAX;
  EdwardsCurve *ec;
  mp_int *yorig;
  EdwardsPoint *pEVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  mp_int *Y;
  mp_int *local_38;
  
  local_38 = in_RAX;
  ec = ecurve();
  yorig = mp_new(0x90);
  pEVar1 = ecc_edwards_point_new_from_y(ec,yorig,0);
  if (pEVar1 != (EdwardsPoint *)0x0) {
    ecc_edwards_point_free(pEVar1);
  }
  sVar2 = (*looplimit)(2);
  if (sVar2 != 0) {
    uVar4 = 0;
    do {
      sVar2 = (*looplimit)(5);
      if (sVar2 != 0) {
        sVar2 = 0;
        do {
          pEVar1 = epoint(ec,sVar2);
          ecc_edwards_get_affine(pEVar1,(mp_int **)0x0,&local_38);
          mp_copy_into(yorig,local_38);
          mp_free(local_38);
          ecc_edwards_point_free(pEVar1);
          test_index = test_index + 1;
          last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
          (*log_to_file)(last_filename);
          pEVar1 = ecc_edwards_point_new_from_y(ec,yorig,(uint)uVar4);
          (*log_to_file)((char *)0x0);
          safefree(last_filename);
          ecc_edwards_point_free(pEVar1);
          sVar2 = sVar2 + 1;
          sVar3 = (*looplimit)(5);
        } while (sVar2 < sVar3);
      }
      uVar4 = uVar4 + 1;
      sVar2 = (*looplimit)(2);
    } while (uVar4 < sVar2);
  }
  mp_free(yorig);
  ecc_edwards_curve_free(ec);
  return;
}

Assistant:

static void test_ecc_edwards_decompress(void)
{
    EdwardsCurve *ec = ecurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *y = mp_new(144);
    EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_edwards_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 0; i < looplimit(5); i++) {
            EdwardsPoint *A = epoint(ec, i);
            mp_int *Y;
            ecc_edwards_get_affine(A, NULL, &Y);
            mp_copy_into(y, Y);
            mp_free(Y);
            ecc_edwards_point_free(A);

            log_start();
            EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, p);
            log_end();

            ecc_edwards_point_free(a);
        }
    }
    mp_free(y);
    ecc_edwards_curve_free(ec);
}